

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_27b883::PeerManagerImpl::SendBlockTransactions
          (PeerManagerImpl *this,CNode *pfrom,Peer *peer,CBlock *block,BlockTransactionsRequest *req
          )

{
  pointer psVar1;
  CConnman *this_00;
  string msg_type;
  pointer puVar2;
  string *message;
  long lVar3;
  long *plVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  BlockTransactions resp;
  undefined8 in_stack_ffffffffffffff08;
  undefined1 local_d8;
  undefined7 uStack_d7;
  undefined8 uStack_d0;
  BlockTransactions local_c8;
  long *local_90 [2];
  long local_80;
  undefined8 uStack_78;
  undefined1 local_70 [64];
  
  local_70._56_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_c8.blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(req->blockhash).super_base_blob<256U>.m_data._M_elems;
  local_c8.blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((req->blockhash).super_base_blob<256U>.m_data._M_elems + 8);
  local_c8.blockhash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((req->blockhash).super_base_blob<256U>.m_data._M_elems + 0x10);
  local_c8.blockhash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((req->blockhash).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&local_c8.txn,
           (long)(req->indexes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(req->indexes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 1,(allocator_type *)local_70);
  puVar2 = (req->indexes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((req->indexes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    lVar3 = 8;
    uVar5 = 0;
    do {
      psVar1 = (block->vtx).
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(block->vtx).
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <=
          (ulong)puVar2[uVar5]) {
        local_70._0_8_ = local_70 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_70,"getblocktxn with out-of-bounds tx indices","");
        Misbehaving((PeerManagerImpl *)peer,(Peer *)local_70,message);
        plVar4 = (long *)local_70._0_8_;
        if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) goto LAB_001e244e;
        goto LAB_001e2456;
      }
      psVar1 = psVar1 + puVar2[uVar5];
      *(element_type **)
       ((long)local_c8.txn.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar3 + -8) =
           (psVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&((local_c8.txn.
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 + lVar3),&(psVar1->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_refcount);
      uVar5 = uVar5 + 1;
      puVar2 = (req->indexes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar5 < (ulong)((long)(req->indexes).
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 1));
  }
  plVar4 = (long *)&local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff18,"blocktxn","");
  this_00 = this->m_connman;
  local_90[0] = plVar4;
  if (plVar4 == (long *)&local_d8) {
    uStack_78 = uStack_d0;
    local_90[0] = &local_80;
  }
  local_80 = CONCAT71(uStack_d7,local_d8);
  local_d8 = 0;
  msg_type._M_string_length = (size_type)peer;
  msg_type._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff08;
  msg_type.field_2._M_allocated_capacity = (size_type)&local_d8;
  msg_type.field_2._8_8_ = 0;
  plVar4 = (long *)&local_d8;
  NetMsg::Make<BlockTransactions&>
            ((CSerializedNetMsg *)local_70,(NetMsg *)local_90,msg_type,&local_c8);
  CConnman::PushMessage(this_00,pfrom,(CSerializedNetMsg *)local_70);
  if ((undefined1 *)local_70._24_8_ != local_70 + 0x28) {
    operator_delete((void *)local_70._24_8_,local_70._40_8_ + 1);
  }
  if ((long *)local_70._0_8_ != (long *)0x0) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ - local_70._0_8_);
  }
  if (local_90[0] != &local_80) {
    operator_delete(local_90[0],local_80 + 1);
  }
  if (plVar4 != (long *)&local_d8) {
    local_70._16_8_ = CONCAT71(uStack_d7,local_d8);
LAB_001e244e:
    operator_delete(plVar4,local_70._16_8_ + NODE_NETWORK);
  }
LAB_001e2456:
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_c8.txn);
  if (*(__pthread_internal_list **)(in_FS_OFFSET + 0x28) !=
      (__pthread_internal_list *)local_70._56_8_) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::SendBlockTransactions(CNode& pfrom, Peer& peer, const CBlock& block, const BlockTransactionsRequest& req)
{
    BlockTransactions resp(req);
    for (size_t i = 0; i < req.indexes.size(); i++) {
        if (req.indexes[i] >= block.vtx.size()) {
            Misbehaving(peer, "getblocktxn with out-of-bounds tx indices");
            return;
        }
        resp.txn[i] = block.vtx[req.indexes[i]];
    }

    MakeAndPushMessage(pfrom, NetMsgType::BLOCKTXN, resp);
}